

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O0

void av1_cdef_copy_sb8_16
               (AV1_COMMON *cm,uint16_t *dst,int dstride,uint8_t *src,int src_voffset,
               int src_hoffset,int sstride,int vsize,int hsize)

{
  uint8_t *in_RCX;
  int in_EDX;
  uint16_t *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_ffffffffffffffd4;
  
  if (*(char *)(*(long *)(in_RDI + 0x6088) + 0x4c) == '\0') {
    av1_cdef_copy_sb8_16_lowbd
              (in_RSI,in_EDX,in_RCX,in_R8D,in_R9D,in_stack_ffffffffffffffd4,unaff_retaddr,
               in_stack_00000008);
  }
  else {
    av1_cdef_copy_sb8_16_highbd
              (in_RSI,in_EDX,in_RCX,in_R8D,in_R9D,in_stack_ffffffffffffffd4,unaff_retaddr,
               in_stack_00000008);
  }
  return;
}

Assistant:

void av1_cdef_copy_sb8_16(const AV1_COMMON *const cm, uint16_t *const dst,
                          int dstride, const uint8_t *src, int src_voffset,
                          int src_hoffset, int sstride, int vsize, int hsize) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (cm->seq_params->use_highbitdepth) {
    av1_cdef_copy_sb8_16_highbd(dst, dstride, src, src_voffset, src_hoffset,
                                sstride, vsize, hsize);
    return;
  }
#else
  (void)cm;
#endif  // CONFIG_AV1_HIGHBITDEPTH
  av1_cdef_copy_sb8_16_lowbd(dst, dstride, src, src_voffset, src_hoffset,
                             sstride, vsize, hsize);
}